

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HModel.cpp
# Opt level: O0

bool __thiscall HModel::allNonbasicMoveVsWorkArrays_OK(HModel *this)

{
  uint *puVar1;
  reference pvVar2;
  long in_RDI;
  int var;
  bool ok;
  int in_stack_00000124;
  HModel *in_stack_00000128;
  uint local_18;
  byte local_11;
  
  local_18 = 0;
  while( true ) {
    if (*(int *)(in_RDI + 0x614) <= (int)local_18) {
      return (bool)(local_11 & 1);
    }
    puVar1 = (uint *)std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),
                                (long)(int)local_18);
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n",(ulong)local_18,
           (ulong)*puVar1);
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x768),(long)(int)local_18);
    if ((*pvVar2 != 0) &&
       (local_11 = oneNonbasicMoveVsWorkArrays_OK(in_stack_00000128,in_stack_00000124),
       !(bool)local_11)) break;
    local_18 = local_18 + 1;
  }
  printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n",(ulong)local_18);
  std::ostream::operator<<((ostream *)&std::cout,std::flush<char,std::char_traits<char>>);
  return (bool)local_11;
}

Assistant:

bool HModel::allNonbasicMoveVsWorkArrays_OK() {
  bool ok;
  for (int var = 0; var < numTot; ++var) {
    printf("NonbasicMoveVsWorkArrays: var = %2d; nonbasicFlag[var] = %2d\n", var, nonbasicFlag[var]);
    if (!nonbasicFlag[var]) continue;
    ok = oneNonbasicMoveVsWorkArrays_OK(var);
    if (!ok) {
      printf("Error in NonbasicMoveVsWorkArrays for nonbasic variable %d\n", var);cout << flush;
#ifdef JAJH_dev
      assert(ok);
#endif
      return ok;
    }
  }
  //ok must be true if we reach here
  assert(ok);
  return ok;
}